

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsFederatePublishJSON(HelicsFederate fed,char *json,HelicsError *err)

{
  size_t sVar1;
  shared_ptr<helics::ValueFederate> fedObj;
  string local_50;
  ValueFederate *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (json != (char *)0x0) {
    getValueFedSharedPtr(&local_30,(HelicsError *)fed);
    if (local_30 != (ValueFederate *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar1 = strlen(json);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,json,json + sVar1);
      helics::ValueFederate::publishJSON(local_30,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  return;
}

Assistant:

void helicsFederatePublishJSON(HelicsFederate fed, const char* json, HelicsError* err)
{
    if (json == nullptr) {  // this isn't an error just doesn't do anything
        return;
    }
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return;
    }
    try {
        fedObj->publishJSON(json);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}